

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_io_block(CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t location;
  SPIRType *type;
  SPIRType *pSVar3;
  Bitset *pBVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  string semantic;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  SPIRVariable *local_b0;
  string local_a8;
  SPIREntryPoint *local_88;
  ulong local_80;
  string local_78;
  ulong local_58;
  string local_50;
  
  local_88 = Compiler::get_entry_point((Compiler *)this);
  local_b0 = var;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(type->super_IVariant).self.id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_d0,this,(ulong)(type->super_IVariant).self.id,1);
  CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string>
            (&this->super_CompilerGLSL,(char (*) [8])"struct ",&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(type->member_name_cache)._M_h);
  uVar2 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(local_b0->super_IVariant).self.id,DecorationLocation);
  if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           buffer_size != 0) {
    local_58 = (ulong)uVar2;
    uVar6 = 0;
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      uVar2 = (uint32_t)uVar6;
      bVar1 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,uVar2,
                         DecorationLocation);
      if (bVar1) {
        location = Compiler::get_member_decoration
                             ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,uVar2,
                              DecorationLocation);
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)local_88->model;
        to_semantic_abi_cxx11_(&local_a8,this,location,local_88->model,local_b0->storage);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_78,(spirv_cross *)0x2ea180,(char (*) [4])&local_a8,pbVar5);
      }
      else {
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)local_88->model;
        to_semantic_abi_cxx11_
                  (&local_a8,this,(int)local_58 + uVar2,local_88->model,local_b0->storage);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_78,(spirv_cross *)0x2ea180,(char (*) [4])&local_a8,pbVar5);
      }
      ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      CompilerGLSL::add_member_name(&this->super_CompilerGLSL,type,uVar2);
      pSVar3 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          (type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar6].
                          id);
      local_80 = uVar6;
      pBVar4 = Compiler::get_member_decoration_bitset
                         ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,uVar2);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2e])(&local_78,this,pBVar4);
      CompilerGLSL::to_member_name_abi_cxx11_
                (&local_50,&this->super_CompilerGLSL,type,(uint32_t)local_80);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                (&local_a8,this,pSVar3,&local_50,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,&local_78,&local_a8,&local_d0,(char (*) [2])0x2ddbde);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      uVar6 = local_80;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uint)(type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size);
  }
  CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2dc0a8);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x24])(&local_d0,this,local_b0);
  CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,(char (*) [8])"static ",&local_d0,(char (*) [2])0x2ddbde);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2dc0a8);
  return;
}

Assistant:

void CompilerHLSL::emit_io_block(const SPIRVariable &var)
{
	auto &execution = get_entry_point();

	auto &type = get<SPIRType>(var.basetype);
	add_resource_name(type.self);

	statement("struct ", to_name(type.self));
	begin_scope();
	type.member_name_cache.clear();

	uint32_t base_location = get_decoration(var.self, DecorationLocation);

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		string semantic;
		if (has_member_decoration(type.self, i, DecorationLocation))
		{
			uint32_t location = get_member_decoration(type.self, i, DecorationLocation);
			semantic = join(" : ", to_semantic(location, execution.model, var.storage));
		}
		else
		{
			// If the block itself has a location, but not its members, use the implicit location.
			// There could be a conflict if the block members partially specialize the locations.
			// It is unclear how SPIR-V deals with this. Assume this does not happen for now.
			uint32_t location = base_location + i;
			semantic = join(" : ", to_semantic(location, execution.model, var.storage));
		}

		add_member_name(type, i);

		auto &membertype = get<SPIRType>(type.member_types[i]);
		statement(to_interpolation_qualifiers(get_member_decoration_bitset(type.self, i)),
		          variable_decl(membertype, to_member_name(type, i)), semantic, ";");
	}

	end_scope_decl();
	statement("");

	statement("static ", variable_decl(var), ";");
	statement("");
}